

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fuzz.c
# Opt level: O0

void test_fuzz(files *filesets)

{
  wchar_t wVar1;
  int iVar2;
  time_t tVar3;
  long in_RDI;
  int trycnt;
  int numbytes;
  int j;
  FILE *f;
  int r;
  int q;
  int i;
  size_t oldsize;
  size_t size;
  char *tmp;
  char *image;
  char *rawimage;
  archive *a;
  archive_entry *ae;
  size_t buffsize;
  int n;
  int64_t blk_offset;
  size_t blk_size;
  void *blk;
  archive *in_stack_ffffffffffffff48;
  archive *paVar4;
  archive *in_stack_ffffffffffffff50;
  void **in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  wchar_t in_stack_ffffffffffffff64;
  archive *in_stack_ffffffffffffff68;
  int local_8c;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  FILE *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  wchar_t in_stack_ffffffffffffff8c;
  int local_70;
  int local_6c;
  void **local_68;
  void **local_60;
  char *local_58;
  archive *local_50;
  void *local_48;
  archive *local_40;
  char *local_30;
  int local_24;
  long local_8;
  
  local_24 = 0;
  local_8 = in_RDI;
  do {
    if (*(long *)(local_8 + (long)local_24 * 0x10 + 8) == 0) {
      return;
    }
    local_30 = buff3 + 0x560790;
    local_48 = (void *)0x0;
    local_50 = (archive *)0x0;
    local_58 = (char *)0x0;
    local_60 = (void **)0x0;
    local_68 = (void **)0x0;
    extract_reference_files((char **)in_stack_ffffffffffffff50);
    if (*(int *)(local_8 + (long)local_24 * 0x10) == 0) {
      local_6c = 0;
      while (*(long *)(*(long *)(local_8 + (long)local_24 * 0x10 + 8) + (long)local_6c * 8) != 0) {
        local_58 = slurpfile((size_t *)&local_60,
                             *(char **)(*(long *)(local_8 + (long)local_24 * 0x10 + 8) +
                                       (long)local_6c * 8));
        local_48 = realloc(local_48,(long)local_68 + (long)local_60);
        memcpy((void *)((long)local_48 + (long)local_68),local_58,(size_t)local_60);
        local_68 = (void **)((long)local_60 + (long)local_68);
        local_60 = local_68;
        free(local_58);
        assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                         (wchar_t)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                         in_stack_ffffffffffffff48);
        local_6c = local_6c + 1;
      }
LAB_0015064a:
      if (local_60 != (void **)0x0) {
        local_50 = (archive *)malloc((size_t)local_60);
        assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                         (wchar_t)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                         in_stack_ffffffffffffff48);
        if (local_50 == (archive *)0x0) {
          return;
        }
        tVar3 = time((time_t *)0x0);
        srand((uint)tVar3);
        for (local_6c = 0; local_6c < 100; local_6c = local_6c + 1) {
          memcpy(local_50,local_48,(size_t)local_60);
          local_70 = (int)((long)((ulong)(uint)((int)local_60 >> 0x1f) << 0x20 |
                                 (ulong)local_60 & 0xffffffff) / 100);
          if (local_70 == 0) {
            local_70 = 1;
          }
          in_stack_ffffffffffffff78 = rand();
          in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 % local_70;
          for (in_stack_ffffffffffffff7c = 0; in_stack_ffffffffffffff7c < in_stack_ffffffffffffff78;
              in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1) {
            iVar2 = rand();
            in_stack_ffffffffffffff64 = CONCAT13((char)iVar2,(int3)in_stack_ffffffffffffff64);
            in_stack_ffffffffffffff68 = local_50;
            iVar2 = rand();
            *(char *)((long)&in_stack_ffffffffffffff68->magic + (ulong)(long)iVar2 % (ulong)local_60
                     ) = (char)((uint)in_stack_ffffffffffffff64 >> 0x18);
          }
          local_8c = 0;
          while ((local_8c < 3 &&
                 (in_stack_ffffffffffffff80 =
                       fopen("after.test.failure.send.this.file.to.libarchive.maintainers.with.system.details"
                             ,"wb"), in_stack_ffffffffffffff80 == (FILE *)0x0))) {
            local_8c = local_8c + 1;
          }
          in_stack_ffffffffffffff58 = local_60;
          fwrite(local_50,1,(size_t)local_60,in_stack_ffffffffffffff80);
          paVar4 = (archive *)0x0;
          assertion_equal_int((char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                              (longlong)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                              0,(char *)0x1507e3,in_stack_ffffffffffffff80);
          fclose(in_stack_ffffffffffffff80);
          local_40 = archive_read_new();
          assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                           (wchar_t)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                           paVar4);
          archive_read_support_filter_all(paVar4);
          paVar4 = local_40;
          assertion_equal_int((char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                              (longlong)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                              (longlong)local_40,(char *)0x150859,in_stack_ffffffffffffff80);
          archive_read_support_format_all(paVar4);
          in_stack_ffffffffffffff48 = local_40;
          assertion_equal_int((char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                              (longlong)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                              (longlong)local_40,(char *)0x150892,in_stack_ffffffffffffff80);
          iVar2 = archive_read_open_memory
                            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0x1508a6);
          if (iVar2 == 0) {
            while (iVar2 = archive_read_next_header
                                     (in_stack_ffffffffffffff50,
                                      (archive_entry **)in_stack_ffffffffffffff48), iVar2 == 0) {
              do {
                iVar2 = archive_read_data_block
                                  ((archive *)
                                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                   in_stack_ffffffffffffff58,(size_t *)in_stack_ffffffffffffff50,
                                   (int64_t *)in_stack_ffffffffffffff48);
              } while (iVar2 == 0);
            }
            archive_read_close((archive *)0x150904);
          }
          archive_read_free((archive *)0x15090e);
        }
        free(local_50);
        free(local_48);
      }
    }
    else {
      local_40 = archive_read_new();
      assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                       (wchar_t)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                       in_stack_ffffffffffffff48);
      archive_read_support_filter_all(in_stack_ffffffffffffff48);
      assertion_equal_int((char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                          (longlong)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                          (longlong)local_40,(char *)0x150251,in_stack_ffffffffffffff80);
      archive_read_support_format_raw
                ((archive *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      in_stack_ffffffffffffff48 = local_40;
      assertion_equal_int((char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                          (longlong)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                          (longlong)local_40,(char *)0x15028a,in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff8c =
           archive_read_open_filenames
                     (in_stack_ffffffffffffff68,
                      (char **)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (size_t)in_stack_ffffffffffffff58);
      if (in_stack_ffffffffffffff8c == L'\0') {
        archive_read_next_header
                  (in_stack_ffffffffffffff50,(archive_entry **)in_stack_ffffffffffffff48);
        paVar4 = local_40;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                            (longlong)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                            (longlong)local_40,(char *)0x1503b4,in_stack_ffffffffffffff80);
        local_48 = malloc(30000000);
        local_60 = (void **)archive_read_data((archive *)
                                              CONCAT44(in_stack_ffffffffffffff8c,
                                                       in_stack_ffffffffffffff88),
                                              in_stack_ffffffffffffff80,
                                              CONCAT44(in_stack_ffffffffffffff7c,
                                                       in_stack_ffffffffffffff78));
        archive_read_next_header(in_stack_ffffffffffffff50,(archive_entry **)paVar4);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                            (longlong)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                            (longlong)local_40,(char *)0x15041e,in_stack_ffffffffffffff80);
        archive_read_free((archive *)0x150428);
        in_stack_ffffffffffffff48 = (archive *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                            (longlong)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,0,
                            (char *)0x150456,in_stack_ffffffffffffff80);
        assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                         (wchar_t)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                         in_stack_ffffffffffffff48);
        if ((**(long **)(local_8 + (long)local_24 * 0x10 + 8) == 0) ||
           (*(long *)(*(long *)(local_8 + (long)local_24 * 0x10 + 8) + 8) == 0)) {
          failure("Internal buffer is not big enough for uncompressed test files");
        }
        else {
          failure("Internal buffer is not big enough for uncompressed test file: %s",
                  **(undefined8 **)(local_8 + (long)local_24 * 0x10 + 8));
        }
        wVar1 = assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60),
                                 (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                                 (wchar_t)in_stack_ffffffffffffff58,
                                 (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        if (wVar1 != L'\0') goto LAB_0015064a;
        free(local_48);
      }
      else {
        archive_read_free((archive *)0x1502cd);
        if ((**(long **)(local_8 + (long)local_24 * 0x10 + 8) == 0) ||
           (*(long *)(*(long *)(local_8 + (long)local_24 * 0x10 + 8) + 8) == 0)) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                         ,L'S');
          test_skipping("Cannot uncompress fileset");
        }
        else {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                         ,L'U');
          test_skipping("Cannot uncompress %s",
                        **(undefined8 **)(local_8 + (long)local_24 * 0x10 + 8));
        }
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static void
test_fuzz(const struct files *filesets)
{
	const void *blk;
	size_t blk_size;
	int64_t blk_offset;
	int n;

	for (n = 0; filesets[n].names != NULL; ++n) {
		const size_t buffsize = 30000000;
		struct archive_entry *ae;
		struct archive *a;
		char *rawimage = NULL, *image = NULL, *tmp = NULL;
		size_t size = 0, oldsize = 0;
		int i, q;

		extract_reference_files(filesets[n].names);
		if (filesets[n].uncompress) {
			int r;
			/* Use format_raw to decompress the data. */
			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_raw(a));
			r = archive_read_open_filenames(a, filesets[n].names, 16384);
			if (r != ARCHIVE_OK) {
				archive_read_free(a);
				if (filesets[n].names[0] == NULL || filesets[n].names[1] == NULL) {
					skipping("Cannot uncompress fileset");
				} else {
					skipping("Cannot uncompress %s", filesets[n].names[0]);
				}
				continue;
			}
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_next_header(a, &ae));
			rawimage = malloc(buffsize);
			size = archive_read_data(a, rawimage, buffsize);
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_next_header(a, &ae));
			assertEqualInt(ARCHIVE_OK,
			    archive_read_free(a));
			assert(size > 0);
			if (filesets[n].names[0] == NULL || filesets[n].names[1] == NULL) {
				failure("Internal buffer is not big enough for "
					"uncompressed test files");
			} else {
				failure("Internal buffer is not big enough for "
					"uncompressed test file: %s", filesets[n].names[0]);
			}
			if (!assert(size < buffsize)) {
				free(rawimage);
				continue;
			}
		} else {
			for (i = 0; filesets[n].names[i] != NULL; ++i)
			{
				tmp = slurpfile(&size, filesets[n].names[i]);
				rawimage = (char *)realloc(rawimage, oldsize + size);
				memcpy(rawimage + oldsize, tmp, size);
				oldsize += size;
				size = oldsize;
				free(tmp);
				if (!assert(rawimage != NULL))
					continue;
			}
		}
		if (size == 0)
			continue;
		image = malloc(size);
		assert(image != NULL);
		if (image == NULL)
			return;
		srand((unsigned)time(NULL));

		for (i = 0; i < 100; ++i) {
			FILE *f;
			int j, numbytes, trycnt;

			/* Fuzz < 1% of the bytes in the archive. */
			memcpy(image, rawimage, size);
			q = (int)size / 100;
			if (!q) q = 1;
			numbytes = (int)(rand() % q);
			for (j = 0; j < numbytes; ++j)
				image[rand() % size] = (char)rand();

			/* Save the messed-up image to a file.
			 * If we crash, that file will be useful. */
			for (trycnt = 0; trycnt < 3; trycnt++) {
				f = fopen("after.test.failure.send.this.file."
				    "to.libarchive.maintainers.with.system.details", "wb");
				if (f != NULL)
					break;
#if defined(_WIN32) && !defined(__CYGWIN__)
				/*
				 * Sometimes previous close operation does not completely
				 * end at this time. So we should take a wait while
				 * the operation running.
				 */
				Sleep(100);
#endif
			}
			assertEqualInt((size_t)size, fwrite(image, 1, (size_t)size, f));
			fclose(f);

			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_all(a));

			if (0 == archive_read_open_memory(a, image, size)) {
				while(0 == archive_read_next_header(a, &ae)) {
					while (0 == archive_read_data_block(a,
						&blk, &blk_size, &blk_offset))
						continue;
				}
				archive_read_close(a);
			}
			archive_read_free(a);
		}
		free(image);
		free(rawimage);
	}
}